

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.cc
# Opt level: O0

ostream * operator<<(ostream *os,v_array<substring> *ss)

{
  substring *psVar1;
  v_array<substring> *in_RSI;
  ostream *in_RDI;
  substring *it;
  substring *local_20;
  
  local_20 = v_array<substring>::cbegin(in_RSI);
  psVar1 = v_array<substring>::cend(in_RSI);
  if (local_20 != psVar1) {
    operator<<((ostream *)ss,it);
    while( true ) {
      local_20 = local_20 + 1;
      psVar1 = v_array<substring>::cend(in_RSI);
      if (local_20 == psVar1) break;
      std::operator<<(in_RDI,",");
      operator<<((ostream *)ss,it);
    }
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const v_array<substring>& ss)
{
  substring* it = ss.cbegin();

  if (it == ss.cend())
  {
    return os;
  }

  os << *it;

  for (it++; it != ss.cend(); it++)
  {
    os << ",";
    os << *it;
  }

  return os;
}